

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
logonAtLogonStartTimeFixture::logonAtLogonStartTimeFixture(logonAtLogonStartTimeFixture *this)

{
  int *piVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  Session *pSVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  TimeRange logonTime;
  UtcTimeOnly local_88;
  UtcTimeOnly local_70;
  TimeRange local_58 [8];
  int local_50;
  undefined4 uStack_4c;
  int64_t iStack_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  Session local_20;
  
  anon_unknown.dwarf_52c65e::sessionFixture::sessionFixture((sessionFixture *)this,0);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_0032b298;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application = (_func_int **)&PTR__logonAtLogonStartTimeFixture_0032b2f0;
  FIX::DateTime::nowUtc();
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.m_date =
       local_50;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.m_time =
       iStack_48;
  uVar2 = *(undefined4 *)
           ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
                   super_DateTime.m_time + 4);
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) = uVar2;
  uVar3 = *(undefined8 *)
           &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime
            .field_0xc;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = uVar3;
  iVar5 = (int)((this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
                super_DateTime.m_time / 1000000000);
  lVar8 = (long)(iVar5 % 0x3c) + (long)(iVar5 / 0xe10) * 0xe10 +
          (long)(((iVar5 / 0x3c) % 0x3c) * 0x3c);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = uVar3;
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) = uVar2;
  iVar5 = (int)((this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
                super_DateTime.m_time / 1000000000);
  lVar10 = (long)(iVar5 % 0x3c) + (long)(iVar5 / 0xe10) * 0xe10 +
           (long)(((iVar5 / 0x3c) % 0x3c) * 0x3c);
  lVar9 = lVar10 * 1000000000;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = lVar9;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  uVar7 = lVar8 * 1000000000 - 10000000000;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_time = uVar7;
  if (lVar8 < 0x1518a) {
    if (lVar8 < 10) {
      (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime
      .m_date = -1;
      uVar7 = lVar8 * 1000000000 + 0x4e923d431c00;
      goto LAB_00283714;
    }
  }
  else {
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    m_date = 1;
    uVar7 = uVar7 % 86400000000000;
LAB_00283714:
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    m_time = uVar7;
  }
  piVar1 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime
            .m_date;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = lVar9 + 10000000000U;
  if (lVar10 < 0x15176) {
    if (-0xb < lVar10) goto LAB_00283777;
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = -1;
    uVar7 = lVar9 + 0x4e96e55ae400;
  }
  else {
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = 1;
    uVar7 = (lVar9 + 10000000000U) % 86400000000000;
  }
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = uVar7;
LAB_00283777:
  uVar7 = *(ulong *)piVar1;
  lVar8 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
          m_time;
  local_70.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00326648;
  uVar6 = *(ulong *)piVar1;
  lVar9 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
          m_time;
  local_88.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00326648;
  local_70.super_DateTime._8_8_ = uVar7 & 0xffffffff00000000;
  uVar3 = local_70.super_DateTime._8_8_;
  local_70.super_DateTime.m_time = lVar8 + 1000000000;
  local_70.super_DateTime._12_4_ = SUB84(uVar7 >> 0x20,0);
  if (lVar8 < 0x4e9455b43600) {
    if (lVar8 < -1000000000) {
      local_70.super_DateTime.m_date = 0xffffffff;
      local_70.super_DateTime.m_time = lVar8 + 0x4e94cce9ca00;
      uVar3 = local_70.super_DateTime._8_8_;
    }
  }
  else {
    local_70.super_DateTime.m_date = 1;
    local_70.super_DateTime.m_time = (ulong)local_70.super_DateTime.m_time % 86400000000000;
    uVar3 = local_70.super_DateTime._8_8_;
  }
  local_70.super_DateTime._8_8_ = uVar3;
  local_88.super_DateTime._8_8_ = uVar6 & 0xffffffff00000000;
  uVar3 = local_88.super_DateTime._8_8_;
  local_88.super_DateTime.m_time = lVar9 + 2000000000;
  local_88.super_DateTime._12_4_ = SUB84(uVar6 >> 0x20,0);
  if (lVar9 < 0x4e941a196c00) {
    if (lVar9 < -2000000000) {
      local_88.super_DateTime.m_date = 0xffffffff;
      local_88.super_DateTime.m_time = lVar9 + 0x4e9508849400;
      uVar3 = local_88.super_DateTime._8_8_;
    }
  }
  else {
    local_88.super_DateTime.m_date = 1;
    local_88.super_DateTime.m_time = (ulong)local_88.super_DateTime.m_time % 86400000000000;
    uVar3 = local_88.super_DateTime._8_8_;
  }
  local_88.super_DateTime._8_8_ = uVar3;
  FIX::TimeRange::TimeRange(local_58,&local_70,&local_88,-1,-1);
  pSVar4 = (this->super_acceptorFixture).super_sessionFixture.object;
  *(ulong *)(pSVar4 + 0x1c8) = CONCAT44(uStack_4c,local_50);
  *(int64_t *)(pSVar4 + 0x1d0) = iStack_48;
  *(undefined8 *)(pSVar4 + 0x1e0) = local_38;
  *(undefined8 *)(pSVar4 + 0x1e8) = uStack_30;
  pSVar4[0x1f8] = local_20;
  *(undefined8 *)(pSVar4 + 0x1f0) = local_28;
  return;
}

Assistant:

logonAtLogonStartTimeFixture() {
    now.setCurrent();
    startTime = now;
    startTime.setMillisecond(0);

    endTime = now;
    endTime.setMillisecond(0);

    startTime += -10;
    endTime += 10;

    UtcTimeOnly logonStartTime(now);
    UtcTimeOnly logonEndTime(now);
    logonStartTime += 1;
    logonEndTime += 2;
    TimeRange logonTime(logonStartTime, logonEndTime);

    object->setLogonTime(logonTime);
  }